

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::web_peer_connection::write_request(web_peer_connection *this,peer_request *r)

{
  web_seed_t *pwVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  element_type *peVar7;
  torrent_info *this_00;
  torrent_info *ptVar8;
  int *piVar9;
  reference r_00;
  size_type sVar10;
  pointer pvVar11;
  file_storage *pfVar12;
  iterator iVar13;
  pointer ppVar14;
  char *pcVar15;
  io_context *ctx;
  undefined8 uVar16;
  file_index_t index;
  vector<char> *this_01;
  bool local_2f1;
  string *local_2d0;
  byte local_2b1;
  span<const_char> local_230;
  uint local_21c;
  undefined1 local_218 [80];
  array<char,_22UL> local_1c8;
  array<char,_22UL> local_1b2;
  uint local_19c;
  string local_198;
  undefined1 local_171;
  undefined8 uStack_170;
  bool trailing_slash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *redirect;
  _Self local_160;
  iterator redirection;
  undefined1 local_150 [8];
  file_request_t file_req_1;
  file_slice *f;
  iterator __end3;
  iterator __begin3;
  vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *__range3;
  undefined1 local_118 [8];
  vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> files;
  array<char,_22UL> local_ea;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_d4;
  undefined1 local_d0 [8];
  file_request_t file_req;
  int num_pad_files;
  bool using_proxy;
  int proxy_type;
  bool single_file_request;
  undefined8 uStack_a8;
  peer_request *front;
  int local_98 [2];
  undefined1 local_90 [4];
  int request_offset;
  peer_request pr;
  int piece_size;
  int block_size;
  int size;
  string request;
  peer_request req;
  torrent_info *info;
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  peer_request *r_local;
  web_peer_connection *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)r;
  peer_connection::associated_torrent((peer_connection *)&info);
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_28);
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr((weak_ptr<libtorrent::aux::torrent> *)&info);
  peVar7 = ::std::
           __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  this_00 = torrent::torrent_file(peVar7);
  req.piece.m_val =
       (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       )->_M_use_count;
  request.field_2._8_8_ =
       (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       )->_vptr__Sp_counted_base;
  ::std::__cxx11::string::string((string *)&block_size);
  ::std::__cxx11::string::reserve((ulong)&block_size);
  piece_size = (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count;
  peVar7 = ::std::
           __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  pr.length = torrent::block_size(peVar7);
  peVar7 = ::std::
           __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  ptVar8 = torrent::torrent_file(peVar7);
  pr.start = torrent_info::piece_length(ptVar8);
  memset(local_90,0,0xc);
  for (; 0 < piece_size; piece_size = piece_size - pr.piece.m_val) {
    local_98[1] = (*(int *)((long)&(t.
                                    super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 4) +
                  (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count) - piece_size;
    request_offset = local_98[1] % pr.start;
    piVar9 = ::std::min<int>(&pr.length,&piece_size);
    local_98[0] = pr.start - request_offset;
    piVar9 = ::std::min<int>(piVar9,local_98);
    pr.piece.m_val = *piVar9;
    iVar3 = strong_typedef::operator_cast_to_int
                      ((strong_typedef *)
                       t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
              ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)((long)&front + 4),
               iVar3 + local_98[1] / pr.start);
    local_90 = (undefined1  [4])front._4_4_;
    ::std::deque<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::push_back
              (&(this->super_web_connection_base).m_requests,(value_type *)local_90);
    pwVar1 = this->m_web;
    r_00 = ::std::deque<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::front
                     (&(this->super_web_connection_base).m_requests);
    bVar2 = peer_request::operator==(&pwVar1->restart_request,r_00);
    if (bVar2) {
      container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>::operator=
                (&this->m_piece,&this->m_web->restart_piece);
      uStack_a8 = ::std::deque<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                  ::front(&(this->super_web_connection_base).m_requests);
      sVar10 = ::std::vector<char,_std::allocator<char>_>::size
                         (&(this->m_piece).super_vector<char,_std::allocator<char>_>);
      uVar4 = strong_typedef::operator_cast_to_int((strong_typedef *)uStack_a8);
      peer_connection::peer_log
                ((peer_connection *)this,info,"RESTART_DATA","data: %d req: (%d, %d) size: %d",
                 sVar10 & 0xffffffff,(ulong)uVar4,*(int *)(uStack_a8 + 4),
                 *(int *)(uStack_a8 + 4) + -1 + *(int *)(uStack_a8 + 8));
      this_01 = &this->m_piece;
      sVar10 = ::std::vector<char,_std::allocator<char>_>::size
                         (&this_01->super_vector<char,_std::allocator<char>_>);
      request.field_2._12_4_ = request.field_2._12_4_ + (int)sVar10;
      sVar10 = ::std::vector<char,_std::allocator<char>_>::size
                         (&this_01->super_vector<char,_std::allocator<char>_>);
      req.piece.m_val = req.piece.m_val - (int)sVar10;
      sVar10 = ::std::vector<char,_std::allocator<char>_>::size
                         (&this_01->super_vector<char,_std::allocator<char>_>);
      peer_connection::incoming_piece_fragment((peer_connection *)this,(int)sVar10);
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&proxy_type,-1);
      (this->m_web->restart_request).piece.m_val = proxy_type;
    }
  }
  uVar5 = strong_typedef::operator_cast_to_int
                    ((strong_typedef *)
                     t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  uVar4 = *(uint *)((long)&(t.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + 4);
  iVar3 = strong_typedef::operator_cast_to_int((strong_typedef *)local_90);
  peer_connection::peer_log
            ((peer_connection *)this,outgoing_message,"REQUESTING",
             "(piece: %d start: %d) - (piece: %d end: %d)",(ulong)uVar5,(ulong)uVar4,iVar3,
             request_offset + pr.piece.m_val);
  peVar7 = ::std::
           __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  ptVar8 = torrent::torrent_file(peVar7);
  iVar3 = torrent_info::num_files(ptVar8);
  iVar6 = session_settings::get_int
                    ((this->super_web_connection_base).super_peer_connection.
                     super_peer_connection_hot_members.m_settings,0x407b);
  if ((iVar6 == 4) || (local_2b1 = 0, iVar6 == 5)) {
    local_2b1 = (this->super_web_connection_base).super_peer_connection.field_0x889 ^ 0xff;
  }
  local_2b1 = local_2b1 & 1;
  file_req.start._4_4_ = 0;
  if (iVar3 == 1) {
    strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::strong_typedef(&local_d4,0);
    local_d0._0_4_ = local_d4.m_val;
    iVar3 = strong_typedef::operator_cast_to_int
                      ((strong_typedef *)(request.field_2._M_local_buf + 8));
    iVar6 = torrent_info::piece_length(this_00);
    file_req._0_8_ = (long)iVar3 * (long)iVar6 + (long)(int)request.field_2._12_4_;
    local_d0._4_4_ = req.piece.m_val;
    ::std::__cxx11::string::operator+=((string *)&block_size,"GET ");
    if (local_2b1 == 0) {
      local_2d0 = (string *)&(this->super_web_connection_base).m_path;
    }
    else {
      local_2d0 = (string *)&this->m_url;
    }
    ::std::__cxx11::string::operator+=((string *)&block_size,local_2d0);
    ::std::__cxx11::string::operator+=((string *)&block_size," HTTP/1.1\r\n");
    (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
      _vptr_bandwidth_socket[0x36])
              (this,&block_size,
               (this->super_web_connection_base).super_peer_connection.
               super_peer_connection_hot_members.m_settings,(ulong)local_2b1);
    ::std::__cxx11::string::operator+=((string *)&block_size,"\r\nRange: bytes=");
    to_string(&local_ea,file_req._0_8_);
    pvVar11 = ::std::array<char,_22UL>::data((array<char,_22UL> *)&local_ea);
    ::std::__cxx11::string::operator+=((string *)&block_size,pvVar11);
    ::std::__cxx11::string::operator+=((string *)&block_size,"-");
    to_string((array<char,_22UL> *)
              &files.
               super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
              file_req._0_8_ + -1 + (long)(int)local_d0._4_4_);
    pvVar11 = ::std::array<char,_22UL>::data
                        ((array<char,_22UL> *)
                         &files.
                          super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::operator+=((string *)&block_size,pvVar11);
    ::std::__cxx11::string::operator+=((string *)&block_size,"\r\n\r\n");
    (this->super_web_connection_base).super_peer_connection.field_0x888 = 0;
    ::std::
    deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
    ::push_back(&this->m_file_requests,(value_type *)local_d0);
  }
  else {
    pfVar12 = torrent_info::orig_files(this_00);
    file_storage::map_block
              ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)local_118,
               pfVar12,(piece_index_t)request.field_2._8_4_,(long)(int)request.field_2._12_4_,
               (long)req.piece.m_val);
    __end3 = ::std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::begin
                       ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)
                        local_118);
    f = (file_slice *)
        ::std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::end
                  ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)
                   local_118);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<libtorrent::file_slice_*,_std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>_>
                                       *)&f), bVar2) {
      file_req_1.start =
           (int64_t)__gnu_cxx::
                    __normal_iterator<libtorrent::file_slice_*,_std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>_>
                    ::operator*(&__end3);
      local_150._0_4_ = (((reference)file_req_1.start)->file_index).m_val;
      file_req_1._0_8_ = ((reference)file_req_1.start)->offset;
      local_150._4_4_ = (undefined4)((reference)file_req_1.start)->size;
      pfVar12 = torrent_info::orig_files(this_00);
      redirection._M_node._4_4_ = *(int *)file_req_1.start;
      bVar2 = file_storage::pad_file_at(pfVar12,redirection._M_node._4_4_);
      if (bVar2) {
        ::std::
        deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
        ::push_back(&this->m_file_requests,(value_type *)local_150);
        file_req.start._4_4_ = file_req.start._4_4_ + 1;
      }
      else {
        ::std::__cxx11::string::operator+=((string *)&block_size,"GET ");
        if (local_2b1 != 0) {
          ::std::__cxx11::string::operator+=((string *)&block_size,(string *)&this->m_url);
        }
        iVar13 = ::std::
                 map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&this->m_web->redirects,(key_type *)file_req_1.start);
        local_160._M_node = iVar13._M_node;
        redirect = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ::std::
                   map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end(&this->m_web->redirects);
        index.m_val = (int)iVar13._M_node;
        bVar2 = ::std::operator!=(&local_160,(_Self *)&redirect);
        if (bVar2) {
          ppVar14 = ::std::
                    _Rb_tree_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator->(&local_160);
          uStack_170 = &ppVar14->second;
          local_2f1 = false;
          if (local_2b1 != 0) {
            uVar4 = ::std::__cxx11::string::empty();
            local_2f1 = false;
            if ((uVar4 & 1) == 0) {
              pcVar15 = (char *)::std::__cxx11::string::operator[](uStack_170);
              local_2f1 = *pcVar15 == '/';
            }
          }
          local_171 = local_2f1;
          ::std::__cxx11::string::append((string *)&block_size,uStack_170,(ulong)local_2f1);
        }
        else {
          if (local_2b1 == 0) {
            ::std::__cxx11::string::operator+=
                      ((string *)&block_size,(string *)&(this->super_web_connection_base).m_path);
          }
          pfVar12 = torrent_info::orig_files(this_00);
          local_19c = *(uint *)file_req_1.start;
          escape_file_path_abi_cxx11_
                    (&local_198,(aux *)pfVar12,(file_storage *)(ulong)local_19c,index);
          ::std::__cxx11::string::operator+=((string *)&block_size,(string *)&local_198);
          ::std::__cxx11::string::~string((string *)&local_198);
        }
        ::std::__cxx11::string::operator+=((string *)&block_size," HTTP/1.1\r\n");
        (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
          _vptr_bandwidth_socket[0x36])
                  (this,&block_size,
                   (this->super_web_connection_base).super_peer_connection.
                   super_peer_connection_hot_members.m_settings,(ulong)local_2b1);
        ::std::__cxx11::string::operator+=((string *)&block_size,"\r\nRange: bytes=");
        to_string(&local_1b2,*(int64_t *)(file_req_1.start + 8));
        pvVar11 = ::std::array<char,_22UL>::data((array<char,_22UL> *)&local_1b2);
        ::std::__cxx11::string::operator+=((string *)&block_size,pvVar11);
        ::std::__cxx11::string::operator+=((string *)&block_size,"-");
        to_string(&local_1c8,
                  *(long *)(file_req_1.start + 8) + -1 + *(long *)(file_req_1.start + 0x10));
        pvVar11 = ::std::array<char,_22UL>::data((array<char,_22UL> *)&local_1c8);
        ::std::__cxx11::string::operator+=((string *)&block_size,pvVar11);
        ::std::__cxx11::string::operator+=((string *)&block_size,"\r\n\r\n");
        (this->super_web_connection_base).super_peer_connection.field_0x888 = 0;
        ::std::
        deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
        ::push_back(&this->m_file_requests,(value_type *)local_150);
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::file_slice_*,_std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>_>
      ::operator++(&__end3);
    }
    ::std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::~vector
              ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)local_118)
    ;
  }
  iVar3 = file_req.start._4_4_;
  sVar10 = ::std::
           deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
           ::size(&this->m_file_requests);
  bVar2 = iVar3 != (int)sVar10;
  if (bVar2) {
    uVar16 = ::std::__cxx11::string::c_str();
    peer_connection::peer_log((peer_connection *)this,outgoing_message,"REQUEST","%s",uVar16);
    span<const_char>::span<char>
              (&local_230,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&block_size);
    peer_connection::send_buffer((peer_connection *)this,local_230);
  }
  else {
    ctx = peer_connection::get_context((peer_connection *)this);
    local_218._32_8_ = on_receive_padfile;
    local_218._40_8_ = (session_settings *)0x0;
    peer_connection::self((peer_connection *)local_218);
    ::std::
    static_pointer_cast<libtorrent::aux::web_peer_connection,libtorrent::aux::peer_connection>
              ((shared_ptr<libtorrent::aux::peer_connection> *)(local_218 + 0x10));
    ::std::
    bind<void(libtorrent::aux::web_peer_connection::*)(),std::shared_ptr<libtorrent::aux::web_peer_connection>>
              ((type *)(local_218 + 0x30),
               (offset_in_web_peer_connection_to_subr *)(local_218 + 0x20),
               (shared_ptr<libtorrent::aux::web_peer_connection> *)(local_218 + 0x10));
    boost::asio::
    post<boost::asio::io_context,std::_Bind<void(libtorrent::aux::web_peer_connection::*(std::shared_ptr<libtorrent::aux::web_peer_connection>))()>>
              (ctx,(_Bind<void_(libtorrent::aux::web_peer_connection::*(std::shared_ptr<libtorrent::aux::web_peer_connection>))()>
                    *)(local_218 + 0x30),(type *)0x0);
    ::std::
    _Bind<void_(libtorrent::aux::web_peer_connection::*(std::shared_ptr<libtorrent::aux::web_peer_connection>))()>
    ::~_Bind((_Bind<void_(libtorrent::aux::web_peer_connection::*(std::shared_ptr<libtorrent::aux::web_peer_connection>))()>
              *)(local_218 + 0x30));
    ::std::shared_ptr<libtorrent::aux::web_peer_connection>::~shared_ptr
              ((shared_ptr<libtorrent::aux::web_peer_connection> *)(local_218 + 0x10));
    ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
              ((shared_ptr<libtorrent::aux::peer_connection> *)local_218);
  }
  local_21c = (uint)!bVar2;
  ::std::__cxx11::string::~string((string *)&block_size);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_28);
  return;
}

Assistant:

void web_peer_connection::write_request(peer_request const& r)
{
	INVARIANT_CHECK;

	auto t = associated_torrent().lock();
	TORRENT_ASSERT(t);

	TORRENT_ASSERT(t->valid_metadata());

	torrent_info const& info = t->torrent_file();
	peer_request req = r;

	std::string request;
	request.reserve(400);

	int size = r.length;
	const int block_size = t->block_size();
	const int piece_size = t->torrent_file().piece_length();
	peer_request pr{};

	while (size > 0)
	{
		int request_offset = r.start + r.length - size;
		pr.start = request_offset % piece_size;
		pr.length = std::min(std::min(block_size, size), piece_size - pr.start);
		pr.piece = piece_index_t(static_cast<int>(r.piece) + request_offset / piece_size);
		TORRENT_ASSERT(validate_piece_request(pr));
		m_requests.push_back(pr);

		if (m_web->restart_request == m_requests.front())
		{
			TORRENT_ASSERT(int(m_piece.size()) == m_received_in_piece);
			TORRENT_ASSERT(m_piece.empty());
			m_piece = std::move(m_web->restart_piece);
			peer_request const& front = m_requests.front();
			TORRENT_ASSERT(front.length > int(m_piece.size()));

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "RESTART_DATA",
				"data: %d req: (%d, %d) size: %d"
					, int(m_piece.size()), static_cast<int>(front.piece), front.start
					, front.start + front.length - 1);
#else
			TORRENT_UNUSED(front);
#endif

			req.start += int(m_piece.size());
			req.length -= int(m_piece.size());

			// just to keep the accounting straight for the upper layer.
			// it doesn't know we just re-wrote the request
			incoming_piece_fragment(int(m_piece.size()));
			m_web->restart_request.piece = piece_index_t(-1);

			TORRENT_ASSERT(int(m_piece.size()) == m_received_in_piece);
		}

#if 0
			std::cerr << this << " REQ: p: " << pr.piece << " " << pr.start << std::endl;
#endif
		size -= pr.length;
	}

#ifndef TORRENT_DISABLE_LOGGING
	peer_log(peer_log_alert::outgoing_message, "REQUESTING", "(piece: %d start: %d) - (piece: %d end: %d)"
		, static_cast<int>(r.piece), r.start
		, static_cast<int>(pr.piece), pr.start + pr.length);
#endif

	bool const single_file_request = t->torrent_file().num_files() == 1;
	int const proxy_type = m_settings.get_int(settings_pack::proxy_type);
	bool const using_proxy = (proxy_type == settings_pack::http
		|| proxy_type == settings_pack::http_pw) && !m_ssl;

	// the number of pad files that have been "requested". In case we _only_
	// request padfiles, we can't rely on handling them in the on_receive()
	// callback (because we won't receive anything), instead we have to post a
	// pretend read callback where we can deliver the zeroes for the partfile
	int num_pad_files = 0;

	// TODO: 3 do we really need a special case here? wouldn't the multi-file
	// case handle single file torrents correctly too?
	if (single_file_request)
	{
		file_request_t file_req;
		file_req.file_index = file_index_t(0);
		file_req.start = std::int64_t(static_cast<int>(req.piece)) * info.piece_length()
			+ req.start;
		file_req.length = req.length;

		request += "GET ";
		// do not encode single file paths, they are
		// assumed to be encoded in the torrent file
		request += using_proxy ? m_url : m_path;
		request += " HTTP/1.1\r\n";
		add_headers(request, m_settings, using_proxy);
		request += "\r\nRange: bytes=";
		request += to_string(file_req.start).data();
		request += "-";
		request += to_string(file_req.start + file_req.length - 1).data();
		request += "\r\n\r\n";
		m_first_request = false;

		m_file_requests.push_back(file_req);
	}
	else
	{
		std::vector<file_slice> files = info.orig_files().map_block(req.piece, req.start
			, req.length);

		for (auto const &f : files)
		{
			file_request_t file_req;
			file_req.file_index = f.file_index;
			file_req.start = f.offset;
			file_req.length = int(f.size);

			if (info.orig_files().pad_file_at(f.file_index))
			{
				m_file_requests.push_back(file_req);
				++num_pad_files;
				continue;
			}

			request += "GET ";
			if (using_proxy)
			{
				// m_url is already a properly escaped URL
				// with the correct slashes. Don't encode it again
				request += m_url;
			}

			auto redirection = m_web->redirects.find(f.file_index);
			if (redirection != m_web->redirects.end())
			{
				auto const& redirect = redirection->second;
				// in case of http proxy "request" already contains m_url with trailing slash, so let's skip dup slash
				bool const trailing_slash = using_proxy && !redirect.empty() && redirect[0] == '/';
				request.append(redirect, trailing_slash, std::string::npos);
			}
			else
			{
				if (!using_proxy)
				{
					// m_path is already a properly escaped URL
					// with the correct slashes. Don't encode it again
					request += m_path;
				}

				request += escape_file_path(info.orig_files(), f.file_index);
			}
			request += " HTTP/1.1\r\n";
			add_headers(request, m_settings, using_proxy);
			request += "\r\nRange: bytes=";
			request += to_string(f.offset).data();
			request += "-";
			request += to_string(f.offset + f.size - 1).data();
			request += "\r\n\r\n";
			m_first_request = false;

#if 0
			std::cerr << this << " SEND-REQUEST: f: " << f.file_index
				<< " s: " << f.offset
				<< " e: " << (f.offset + f.size - 1) << std::endl;
#endif
			// TODO: 3 file_index_t should not allow negative values
			TORRENT_ASSERT(f.file_index >= file_index_t(0));

			m_file_requests.push_back(file_req);
		}
	}

	if (num_pad_files == int(m_file_requests.size()))
	{
		post(get_context(), std::bind(
			&web_peer_connection::on_receive_padfile,
			std::static_pointer_cast<web_peer_connection>(self())));
		return;
	}

#ifndef TORRENT_DISABLE_LOGGING
	peer_log(peer_log_alert::outgoing_message, "REQUEST", "%s", request.c_str());
#endif

	send_buffer(request);
}